

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O1

bool google::ParseType(State *state)

{
  char cVar1;
  char cVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  undefined4 uVar8;
  undefined2 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  undefined4 uVar16;
  undefined2 uVar17;
  undefined1 uVar18;
  undefined1 uVar19;
  int iVar20;
  short sVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  long lVar25;
  undefined8 *puVar26;
  char *pcVar27;
  State copy;
  State copy_1;
  
  pcVar3 = state->mangled_cur;
  pcVar4 = state->out_cur;
  pcVar5 = state->out_begin;
  pcVar6 = state->out_end;
  pcVar7 = state->prev_name;
  uVar8 = state->prev_name_length;
  uVar9 = state->nest_level;
  uVar10 = state->append;
  uVar11 = state->overflowed;
  bVar23 = ParseCVQualifiers(state);
  if ((bVar23) && (bVar23 = ParseType(state), bVar23)) {
    return true;
  }
  state->mangled_cur = pcVar3;
  state->out_cur = pcVar4;
  state->prev_name = pcVar7;
  state->prev_name_length = uVar8;
  state->nest_level = uVar9;
  state->append = (bool)uVar10;
  state->overflowed = (bool)uVar11;
  state->out_begin = pcVar5;
  state->out_end = pcVar6;
  cVar1 = *state->mangled_cur;
  bVar23 = true;
  if (cVar1 != 'O') {
    lVar25 = 0;
    do {
      cVar2 = "OPRCG"[lVar25 + 1];
      if (lVar25 == 4) {
        bVar23 = cVar2 != '\0';
        goto LAB_0011948a;
      }
      lVar25 = lVar25 + 1;
    } while (cVar1 != cVar2);
    bVar23 = cVar2 != '\0';
  }
  state->mangled_cur = state->mangled_cur + 1;
LAB_0011948a:
  if ((bVar23) && (bVar23 = ParseType(state), bVar23)) {
    return true;
  }
  state->mangled_cur = pcVar3;
  state->out_cur = pcVar4;
  state->prev_name = pcVar7;
  state->prev_name_length = uVar8;
  state->nest_level = uVar9;
  state->append = (bool)uVar10;
  state->overflowed = (bool)uVar11;
  state->out_begin = pcVar5;
  state->out_end = pcVar6;
  pcVar27 = state->mangled_cur;
  if ((*pcVar27 == 'D') && (pcVar27[1] == 'p')) {
    state->mangled_cur = pcVar27 + 2;
    bVar23 = ParseType(state);
    if (bVar23) {
      return true;
    }
  }
  state->mangled_cur = pcVar3;
  state->out_cur = pcVar4;
  state->prev_name = pcVar7;
  state->prev_name_length = uVar8;
  state->nest_level = uVar9;
  state->append = (bool)uVar10;
  state->overflowed = (bool)uVar11;
  state->out_begin = pcVar5;
  state->out_end = pcVar6;
  pcVar27 = state->mangled_cur;
  if (*pcVar27 == 'D') {
    state->mangled_cur = pcVar27 + 1;
    bVar23 = true;
    if (pcVar27[1] != 't') {
      lVar25 = 0;
      do {
        cVar1 = "tT"[lVar25 + 1];
        if (lVar25 == 1) {
          bVar23 = cVar1 != '\0';
          goto LAB_0011953f;
        }
        lVar25 = lVar25 + 1;
      } while (pcVar27[1] != cVar1);
      bVar23 = cVar1 != '\0';
    }
    state->mangled_cur = pcVar27 + 2;
LAB_0011953f:
    if (((!bVar23) || (bVar23 = ParseExpression(state), !bVar23)) ||
       (pcVar27 = state->mangled_cur, *pcVar27 != 'E')) goto LAB_0011955b;
LAB_0011963e:
    state->mangled_cur = pcVar27 + 1;
  }
  else {
LAB_0011955b:
    state->mangled_cur = pcVar3;
    state->out_cur = pcVar4;
    state->prev_name = pcVar7;
    state->prev_name_length = uVar8;
    state->nest_level = uVar9;
    state->append = (bool)uVar10;
    state->overflowed = (bool)uVar11;
    state->out_begin = pcVar5;
    state->out_end = pcVar6;
    if (*state->mangled_cur == 'U') {
      state->mangled_cur = state->mangled_cur + 1;
      bVar23 = ParseSourceName(state);
      if ((bVar23) && (bVar23 = ParseType(state), bVar23)) {
        return true;
      }
    }
    state->mangled_cur = pcVar3;
    state->out_cur = pcVar4;
    state->prev_name = pcVar7;
    state->prev_name_length = uVar8;
    state->nest_level = uVar9;
    state->append = (bool)uVar10;
    state->overflowed = (bool)uVar11;
    state->out_begin = pcVar5;
    state->out_end = pcVar6;
    cVar1 = *state->mangled_cur;
    pcVar27 = "v";
    puVar26 = (undefined8 *)(kBuiltinTypeList + 0x10);
    do {
      if (cVar1 == *pcVar27) {
        MaybeAppend(state,(char *)puVar26[-1]);
        state->mangled_cur = state->mangled_cur + 1;
        return true;
      }
      pcVar27 = (char *)*puVar26;
      puVar26 = puVar26 + 2;
    } while (pcVar27 != (char *)0x0);
    if (cVar1 == 'u') {
      state->mangled_cur = state->mangled_cur + 1;
      bVar23 = ParseSourceName(state);
      if (bVar23) {
        return true;
      }
    }
    state->mangled_cur = pcVar3;
    state->out_cur = pcVar4;
    state->prev_name = pcVar7;
    state->prev_name_length = uVar8;
    state->nest_level = uVar9;
    state->append = (bool)uVar10;
    state->overflowed = (bool)uVar11;
    state->out_begin = pcVar5;
    state->out_end = pcVar6;
    pcVar27 = state->mangled_cur;
    if (*pcVar27 == 'F') {
      state->mangled_cur = pcVar27 + 1;
      if (pcVar27[1] == 'Y') {
        state->mangled_cur = pcVar27 + 2;
      }
      bVar23 = ParseBareFunctionType(state);
      if ((bVar23) && (pcVar27 = state->mangled_cur, *pcVar27 == 'E')) goto LAB_0011963e;
    }
    state->prev_name = pcVar7;
    state->prev_name_length = uVar8;
    state->nest_level = uVar9;
    state->append = (bool)uVar10;
    state->overflowed = (bool)uVar11;
    state->out_begin = pcVar5;
    state->out_end = pcVar6;
    state->mangled_cur = pcVar3;
    state->out_cur = pcVar4;
    bVar23 = ParseName(state);
    if (bVar23) {
      return true;
    }
    pcVar27 = state->mangled_cur;
    pcVar12 = state->out_cur;
    pcVar13 = state->out_begin;
    pcVar14 = state->out_end;
    pcVar15 = state->prev_name;
    uVar16 = state->prev_name_length;
    uVar17 = state->nest_level;
    uVar18 = state->append;
    uVar19 = state->overflowed;
    if (*state->mangled_cur == 'A') {
      state->mangled_cur = state->mangled_cur + 1;
      bVar23 = ParseNumber(state,(int *)0x0);
      if ((bVar23) && (*state->mangled_cur == '_')) {
        state->mangled_cur = state->mangled_cur + 1;
        bVar23 = ParseType(state);
        if (bVar23) {
          return true;
        }
      }
    }
    state->mangled_cur = pcVar27;
    state->out_cur = pcVar12;
    state->prev_name = pcVar15;
    state->prev_name_length = uVar16;
    state->nest_level = uVar17;
    state->append = (bool)uVar18;
    state->overflowed = (bool)uVar19;
    state->out_begin = pcVar13;
    state->out_end = pcVar14;
    if (*state->mangled_cur == 'A') {
      state->mangled_cur = state->mangled_cur + 1;
      ParseExpression(state);
      if (*state->mangled_cur == '_') {
        state->mangled_cur = state->mangled_cur + 1;
        bVar23 = ParseType(state);
        if (bVar23) {
          return true;
        }
      }
    }
    state->prev_name = pcVar15;
    state->prev_name_length = uVar16;
    state->nest_level = uVar17;
    state->append = (bool)uVar18;
    state->overflowed = (bool)uVar19;
    state->out_begin = pcVar13;
    state->out_end = pcVar14;
    state->mangled_cur = pcVar27;
    state->out_cur = pcVar12;
    pcVar27 = state->mangled_cur;
    pcVar12 = state->out_cur;
    pcVar13 = state->out_begin;
    pcVar14 = state->out_end;
    pcVar15 = state->prev_name;
    iVar20 = state->prev_name_length;
    sVar21 = state->nest_level;
    bVar23 = state->append;
    bVar22 = state->overflowed;
    if (*state->mangled_cur == 'M') {
      state->mangled_cur = state->mangled_cur + 1;
      bVar24 = ParseType(state);
      if ((bVar24) && (bVar24 = ParseType(state), bVar24)) {
        return true;
      }
    }
    state->prev_name = pcVar15;
    state->prev_name_length = iVar20;
    state->nest_level = sVar21;
    state->append = bVar23;
    state->overflowed = bVar22;
    state->out_begin = pcVar13;
    state->out_end = pcVar14;
    state->mangled_cur = pcVar27;
    state->out_cur = pcVar12;
    bVar23 = ParseSubstitution(state);
    if (bVar23) {
      return true;
    }
    bVar23 = ParseTemplateParam(state);
    if (((!bVar23) && (bVar23 = ParseSubstitution(state), !bVar23)) ||
       (bVar23 = ParseTemplateArgs(state), !bVar23)) {
      state->prev_name = pcVar7;
      state->prev_name_length = uVar8;
      state->nest_level = uVar9;
      state->append = (bool)uVar10;
      state->overflowed = (bool)uVar11;
      state->out_begin = pcVar5;
      state->out_end = pcVar6;
      state->mangled_cur = pcVar3;
      state->out_cur = pcVar4;
      bVar23 = ParseTemplateParam(state);
      return bVar23;
    }
  }
  return true;
}

Assistant:

static bool ParseType(State *state) {
  // We should check CV-qualifers, and PRGC things first.
  State copy = *state;
  if (ParseCVQualifiers(state) && ParseType(state)) {
    return true;
  }
  *state = copy;

  if (ParseCharClass(state, "OPRCG") && ParseType(state)) {
    return true;
  }
  *state = copy;

  if (ParseTwoCharToken(state, "Dp") && ParseType(state)) {
    return true;
  }
  *state = copy;

  if (ParseOneCharToken(state, 'D') && ParseCharClass(state, "tT") &&
      ParseExpression(state) && ParseOneCharToken(state, 'E')) {
    return true;
  }
  *state = copy;

  if (ParseOneCharToken(state, 'U') && ParseSourceName(state) &&
      ParseType(state)) {
    return true;
  }
  *state = copy;

  if (ParseBuiltinType(state) ||
      ParseFunctionType(state) ||
      ParseClassEnumType(state) ||
      ParseArrayType(state) ||
      ParsePointerToMemberType(state) ||
      ParseSubstitution(state)) {
    return true;
  }

  if (ParseTemplateTemplateParam(state) &&
      ParseTemplateArgs(state)) {
    return true;
  }
  *state = copy;

  // Less greedy than <template-template-param> <template-args>.
  if (ParseTemplateParam(state)) {
    return true;
  }

  return false;
}